

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

size_t embree::sse2::createMortonCodeArray<embree::Instance>
                 (Instance *mesh,mvector<BVHBuilderMorton::BuildPrim> *morton,
                 BuildProgressMonitor *progressMonitor)

{
  MortonCodeMapping *pMVar1;
  intrusive_list_node *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  intrusive_list_node *piVar5;
  char cVar6;
  int iVar7;
  runtime_error *prVar8;
  ulong uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  float fVar12;
  undefined8 extraout_XMM1_Qa;
  float fVar14;
  float fVar15;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar13 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  size_t taskCount;
  MortonCodeMapping mapping_1;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_primrefgen_cpp:177:14)>
  body;
  pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> cb_empty;
  task_group_context context;
  auto_partitioner local_591;
  unsigned_long local_590;
  unsigned_long local_588;
  intrusive_list_node *local_580;
  anon_class_8_1_898bcfc2_conflict11 local_578;
  anon_class_24_3_aac2c921 local_570;
  anon_class_40_5_11684cf9_conflict2 local_558;
  undefined1 local_530 [8];
  undefined1 local_528 [16];
  undefined8 local_518;
  uint uStack_510;
  uint uStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [12];
  undefined2 uStack_4dc;
  undefined2 uStack_4da;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_4d8;
  uint uStack_4d0;
  uint uStack_4cc;
  intrusive_list_node *local_4c8;
  intrusive_list_node *piStack_4c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4a8 [4];
  undefined1 local_468 [16];
  pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> *local_458;
  anon_class_16_2_ed117de8_conflict8 *paStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  ParallelPrefixSumState<unsigned_long> local_430;
  
  local_570.mapping = (MortonCodeMapping *)local_530;
  piVar2 = (intrusive_list_node *)morton->size_active;
  local_468._0_8_ = (intrusive_list_node *)0x0;
  local_458 = (pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> *)0x7f8000007f800000;
  paStack_450 = (anon_class_16_2_ed117de8_conflict8 *)0x7f8000007f800000;
  local_448 = 0xff800000ff800000;
  uStack_440 = 0xff800000ff800000;
  local_430.counts[1]._4_2_ = 0x401;
  local_430.counts[4] = 0;
  local_430.counts[5] = 0;
  local_430.counts[8] = 8;
  local_530 = (undefined1  [8])mesh;
  tbb::detail::r1::initialize((task_group_context *)&local_430);
  local_558.last = (unsigned_long *)0x0;
  local_558.taskCount = (size_t *)0x400;
  local_528._0_8_ = &local_590;
  pMVar1 = (MortonCodeMapping *)(local_530 + 8);
  local_4c8 = (intrusive_list_node *)local_468._0_8_;
  local_4b8._0_8_ = local_458;
  local_4b8._8_8_ = paStack_450;
  local_4a8[0]._0_8_ = local_448;
  local_4a8[0]._8_8_ = uStack_440;
  local_558.first = (unsigned_long *)piVar2;
  local_528._8_8_ = &local_570;
  local_4e8._0_8_ = (pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> *)local_468;
  unique0x10000b84 = pMVar1;
  local_4d8.my_parent = (task_group_context *)local_528._0_8_;
  tbb::detail::d1::
  start_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/../../common/algorithms/parallel_reduce.h:59:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/primrefgen.cpp:177:14)>,_const_tbb::detail::d1::auto_partitioner>
  ::run((blocked_range<unsigned_long> *)&local_558,
        (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_primrefgen_cpp:177:14)>
         *)local_4e8,(auto_partitioner *)&local_578,(task_group_context *)&local_430);
  piVar5 = local_4c8;
  local_508 = (pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> *)local_4b8._0_8_;
  uStack_500 = (anon_class_16_2_ed117de8_conflict8 *)local_4b8._8_8_;
  local_4f8 = local_4a8[0]._0_8_;
  uStack_4f0 = local_4a8[0]._8_8_;
  cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_430);
  if (cVar6 != '\0') {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"task cancelled");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)&local_430);
  auVar13._8_8_ = extraout_XMM1_Qb;
  auVar13._0_8_ = extraout_XMM1_Qa;
  fVar17 = (float)local_4f8 - (float)local_508;
  fVar18 = local_4f8._4_4_ - local_508._4_4_;
  fVar19 = (float)uStack_4f0 - (float)uStack_500;
  fVar20 = uStack_4f0._4_4_ - uStack_500._4_4_;
  if (piVar5 == piVar2) {
    local_4e8._0_8_ = local_508;
    unique0x10000784 = (MortonCodeMapping *)uStack_500;
    auVar3._4_4_ = fVar18;
    auVar3._0_4_ = fVar17;
    auVar3._8_4_ = fVar19;
    auVar3._12_4_ = fVar20;
    auVar13 = rcpps(auVar13,auVar3);
    fVar12 = auVar13._0_4_;
    fVar14 = auVar13._4_4_;
    fVar15 = auVar13._8_4_;
    fVar16 = auVar13._12_4_;
    uStack_4d0 = (uint)(((1.0 - fVar19 * fVar15) * fVar15 + fVar15) * 1013.76) &
                 -(uint)(1e-19 < fVar19);
    uStack_4cc = (uint)(((1.0 - fVar20 * fVar16) * fVar16 + fVar16) * 1013.76) &
                 -(uint)(1e-19 < fVar20);
    local_4d8._4_4_ =
         (uint)(((1.0 - fVar18 * fVar14) * fVar14 + fVar14) * 1013.76) & -(uint)(1e-19 < fVar18);
    local_4d8._0_4_ =
         (uint)(((1.0 - fVar17 * fVar12) * fVar12 + fVar12) * 1013.76) & -(uint)(1e-19 < fVar17);
    local_430.counts[1]._4_2_ = 0x401;
    local_430.counts[4] = 0;
    local_430.counts[5] = 0;
    local_430.counts[8] = 8;
    local_528._0_8_ =
         (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_primrefgen_cpp:177:14)>
          *)local_4e8;
    local_528._8_8_ = morton;
    local_518 = (TriangleMesh **)local_530;
    tbb::detail::r1::initialize((task_group_context *)&local_430);
    local_558.last = (unsigned_long *)0x0;
    local_558.taskCount = (size_t *)0x400;
    local_570.mapping = pMVar1;
    local_558.first = (unsigned_long *)piVar2;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&local_558,(anon_class_8_1_898bcfc2 *)&local_570,
          (auto_partitioner *)&local_578,(task_group_context *)&local_430);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_430);
    if (cVar6 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&local_430);
  }
  else {
    local_528._0_8_ = local_508;
    local_528._8_8_ = uStack_500;
    auVar4._4_4_ = fVar18;
    auVar4._0_4_ = fVar17;
    auVar4._8_4_ = fVar19;
    auVar4._12_4_ = fVar20;
    auVar13 = rcpps(auVar13,auVar4);
    fVar12 = auVar13._0_4_;
    fVar14 = auVar13._4_4_;
    fVar15 = auVar13._8_4_;
    fVar16 = auVar13._12_4_;
    uStack_510 = (uint)(((1.0 - fVar19 * fVar15) * fVar15 + fVar15) * 1013.76) &
                 -(uint)(1e-19 < fVar19);
    uStack_50c = (uint)(((1.0 - fVar20 * fVar16) * fVar16 + fVar16) * 1013.76) &
                 -(uint)(1e-19 < fVar20);
    local_518 = (TriangleMesh **)
                CONCAT44((uint)(((1.0 - fVar18 * fVar14) * fVar14 + fVar14) * 1013.76) &
                         -(uint)(1e-19 < fVar18),
                         (uint)(((1.0 - fVar17 * fVar12) * fVar12 + fVar12) * 1013.76) &
                         -(uint)(1e-19 < fVar17));
    local_590 = 0;
    local_580 = piVar2;
    local_570.mapping = pMVar1;
    local_570.morton = morton;
    local_570.mesh = (TriangleMesh **)local_530;
    iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar9 = (long)local_580 + (0x3ff - local_590) >> 10;
    if ((ulong)(long)iVar7 < uVar9) {
      uVar9 = (long)iVar7;
    }
    uVar10 = 0x40;
    if (uVar9 < 0x40) {
      uVar10 = uVar9;
    }
    local_558.taskCount = &local_588;
    local_558.first = &local_590;
    local_558.state = &local_430;
    local_558.func = &local_570;
    stack0xfffffffffffffb20 = CONCAT24(0x401,local_4e8._8_4_);
    local_4c8 = (intrusive_list_node *)0x0;
    piStack_4c0 = (intrusive_list_node *)0x0;
    local_4a8[0]._0_8_ = 8;
    local_588 = uVar10;
    local_558.last = (unsigned_long *)&local_580;
    tbb::detail::r1::initialize((task_group_context *)local_4e8);
    local_578.func = &local_558;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar10,1,&local_578,&local_591,(task_group_context *)local_4e8);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_4e8);
    if (cVar6 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_4e8);
    if (local_588 != 0) {
      uVar10 = 0;
      uVar11 = 0;
      do {
        local_430.sums[uVar10] = uVar11;
        uVar11 = uVar11 + local_430.counts[uVar10];
        uVar10 = uVar10 + 1;
      } while (local_588 != uVar10);
    }
    local_590 = 0;
    local_580 = piVar2;
    local_570.mapping = pMVar1;
    local_570.morton = morton;
    local_570.mesh = (TriangleMesh **)local_530;
    iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar9 = (long)local_580 + (0x3ff - local_590) >> 10;
    if ((ulong)(long)iVar7 < uVar9) {
      uVar9 = (long)iVar7;
    }
    uVar10 = 0x40;
    if (uVar9 < 0x40) {
      uVar10 = uVar9;
    }
    local_558.first = &local_590;
    local_558.last = (unsigned_long *)&local_580;
    local_558.taskCount = &local_588;
    local_558.state = &local_430;
    local_558.func = &local_570;
    stack0xfffffffffffffb20 = CONCAT24(0x401,local_4e8._8_4_);
    local_4c8 = (intrusive_list_node *)0x0;
    piStack_4c0 = (intrusive_list_node *)0x0;
    local_4a8[0]._0_8_ = 8;
    local_588 = uVar10;
    tbb::detail::r1::initialize((task_group_context *)local_4e8);
    local_578.func = &local_558;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar10,1,&local_578,&local_591,(task_group_context *)local_4e8);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_4e8);
    if (cVar6 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_4e8);
    if (local_588 != 0) {
      uVar10 = 0;
      uVar11 = 0;
      do {
        local_430.sums[uVar10] = uVar11;
        uVar11 = uVar11 + local_430.counts[uVar10];
        uVar10 = uVar10 + 1;
      } while (local_588 != uVar10);
    }
  }
  return (size_t)piVar5;
}

Assistant:

size_t createMortonCodeArray(Mesh* mesh, mvector<BVHBuilderMorton::BuildPrim>& morton, BuildProgressMonitor& progressMonitor)
    {
      size_t numPrimitives = morton.size();

      /* compute scene bounds */
      std::pair<size_t,BBox3fa> cb_empty(0,empty);
      auto cb = parallel_reduce 
        ( size_t(0), numPrimitives, size_t(1024), cb_empty, [&](const range<size_t>& r) -> std::pair<size_t,BBox3fa>
          {
            size_t num = 0;
            BBox3fa bounds = empty;
            
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa prim_bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&prim_bounds))) continue;
              bounds.extend(center2(prim_bounds));
              num++;
            }
            return std::make_pair(num,bounds);
          }, [] (const std::pair<size_t,BBox3fa>& a, const std::pair<size_t,BBox3fa>& b) {
          return std::make_pair(a.first + b.first,merge(a.second,b.second)); 
        });
      
      
      size_t numPrimitivesGen = cb.first;
      const BBox3fa centBounds = cb.second;
      
      /* compute morton codes */
      if (likely(numPrimitivesGen == numPrimitives))
      {
        /* fast path if all primitives were valid */
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_for( size_t(0), numPrimitives, size_t(1024), [&](const range<size_t>& r) -> void {
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
              generator(mesh->bounds(j),unsigned(j));
          });
      }
      else
      {
        /* slow path, fallback in case some primitives were invalid */
        ParallelPrefixSumState<size_t> pstate;
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&bounds))) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());
        
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[base]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (!mesh->buildBounds(j,&bounds)) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());          
      }
      return numPrimitivesGen;
    }